

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  u32 *puVar1;
  int iVar2;
  u32 uVar3;
  u32 *puVar4;
  
  iVar2 = walIndexPage(pWal,iHash,&pLoc->aPgno);
  if (iVar2 == 0) {
    puVar1 = pLoc->aPgno;
    uVar3 = iHash * 0x1000 - 0x22;
    puVar4 = puVar1 + 0x22;
    if (iHash != 0) {
      puVar4 = puVar1;
    }
    if (iHash == 0) {
      uVar3 = 0;
    }
    pLoc->aHash = (ht_slot *)(puVar1 + 0x1000);
    pLoc->iZero = uVar3;
    pLoc->aPgno = puVar4 + -1;
  }
  return iVar2;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( rc==SQLITE_OK ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
    pLoc->aPgno = &pLoc->aPgno[-1];
  }
  return rc;
}